

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error asmjit::v1_14::JitAllocatorImpl_shrink
                (JitAllocatorPrivateImpl *impl,Span *span,size_t newSize,bool alreadyUnderWriteScope
                )

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  uint32_t areaSize;
  JitAllocatorPool *this;
  uint8_t *puVar4;
  ulong uVar5;
  size_t sVar6;
  void *mem;
  byte in_CL;
  size_t in_RDX;
  size_t *in_RSI;
  JitAllocatorOptions *in_RDI;
  ProtectJitReadWriteScope scope;
  size_t spanSize;
  uint8_t *spanPtr;
  uint32_t areaDiff;
  uint32_t areaShrunkSize;
  uint32_t spanPrevSize;
  uint32_t areaPrevSize;
  uint32_t areaEnd;
  bool isUsed;
  uint32_t areaStart;
  size_t offset;
  JitAllocatorPool *pool;
  LockGuard guard;
  JitAllocatorBlock *block;
  CachePolicy in_stack_ffffffffffffff0c;
  ProtectJitReadWriteScope *this_00;
  void *in_stack_ffffffffffffff18;
  ProtectJitReadWriteScope *in_stack_ffffffffffffff20;
  uint32_t in_stack_ffffffffffffff2c;
  undefined8 in_stack_ffffffffffffff30;
  JitAllocatorBlock *in_stack_ffffffffffffff38;
  pthread_mutex_t *local_90;
  JitAllocatorBlock *local_88;
  byte local_79;
  size_t local_78;
  size_t *local_70;
  JitAllocatorOptions *local_68;
  Error local_5c;
  pthread_mutex_t *local_58;
  pthread_mutex_t **local_50;
  pthread_mutex_t **local_48;
  size_t *local_40;
  ulong local_38;
  ulong local_30;
  undefined8 local_28;
  ulong local_20;
  BitWord *local_18;
  pthread_mutex_t *local_10;
  pthread_mutex_t *local_8;
  
  local_79 = in_CL & 1;
  local_88 = (JitAllocatorBlock *)in_RSI[3];
  if (local_88 == (JitAllocatorBlock *)0x0) {
    local_5c = DebugUtils::errored(2);
  }
  else {
    local_58 = (pthread_mutex_t *)(in_RDI + 4);
    local_50 = &local_90;
    local_78 = in_RDX;
    local_70 = in_RSI;
    local_68 = in_RDI;
    local_10 = local_58;
    local_90 = local_58;
    pthread_mutex_lock(local_58);
    this = JitAllocatorBlock::pool(local_88);
    local_40 = local_70;
    this_00 = (ProtectJitReadWriteScope *)*local_70;
    puVar4 = JitAllocatorBlock::rxPtr(local_88);
    uVar5 = (ulong)((long)this_00 - (long)puVar4) >> (this->granularityLog2 & 0x3f);
    local_18 = local_88->_usedBitVector;
    local_20 = uVar5 & 0xffffffff;
    local_28 = 0x40;
    local_30 = local_20 >> 6;
    local_38 = uVar5 & 0x3f;
    if ((local_18[local_30] >> (sbyte)local_38 & 1) == 0) {
      local_5c = DebugUtils::errored(2);
    }
    else {
      sVar6 = Support::bitVectorIndexOf<unsigned_long>
                        (local_88->_stopBitVector,uVar5 & 0xffffffff,true);
      uVar3 = ((int)sVar6 + 1) - (int)uVar5;
      uVar1 = this->granularity;
      areaSize = JitAllocatorPool::areaSizeFromByteSize(this,local_78);
      if (uVar3 < areaSize) {
        local_5c = DebugUtils::errored(2);
      }
      else {
        if (uVar3 - areaSize != 0) {
          JitAllocatorBlock::markShrunkArea
                    (in_stack_ffffffffffffff38,(uint32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     (uint32_t)in_stack_ffffffffffffff30);
          sVar6 = JitAllocatorPool::byteSizeFromAreaSize(this,areaSize);
          local_70[2] = sVar6;
        }
        if ((local_78 < uVar3 * uVar1) &&
           (bVar2 = Support::
                    test<asmjit::v1_14::JitAllocatorOptions,asmjit::v1_14::JitAllocatorOptions>
                              (*local_68,kFillUnusedMemory), bVar2)) {
          JitAllocatorBlock::rwPtr(local_88);
          mem = (void *)(ulong)((uVar3 - areaSize) * (uint)this->granularity);
          if ((local_79 & 1) == 0) {
            VirtMem::ProtectJitReadWriteScope::ProtectJitReadWriteScope
                      (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,(size_t)this_00,
                       in_stack_ffffffffffffff0c);
            JitAllocatorImpl_fillPattern
                      (mem,in_stack_ffffffffffffff2c,(size_t)in_stack_ffffffffffffff20);
            VirtMem::ProtectJitReadWriteScope::~ProtectJitReadWriteScope(this_00);
          }
          else {
            JitAllocatorImpl_fillPattern
                      (mem,in_stack_ffffffffffffff2c,(size_t)in_stack_ffffffffffffff20);
          }
        }
        local_5c = 0;
      }
    }
    local_48 = &local_90;
    local_8 = local_90;
    pthread_mutex_unlock(local_90);
  }
  return local_5c;
}

Assistant:

static Error JitAllocatorImpl_shrink(JitAllocatorPrivateImpl* impl, JitAllocator::Span& span, size_t newSize, bool alreadyUnderWriteScope) noexcept {
  JitAllocatorBlock* block = static_cast<JitAllocatorBlock*>(span._block);
  if (ASMJIT_UNLIKELY(!block))
    return DebugUtils::errored(kErrorInvalidArgument);

  LockGuard guard(impl->lock);

  // Offset relative to the start of the block.
  JitAllocatorPool* pool = block->pool();
  size_t offset = (size_t)((uint8_t*)span.rx() - block->rxPtr());

  // The first bit representing the allocated area and its size.
  uint32_t areaStart = uint32_t(offset >> pool->granularityLog2);

  // Don't trust `span.size()` - if it has been already truncated we would be off...
  bool isUsed = Support::bitVectorGetBit(block->_usedBitVector, areaStart);
  if (ASMJIT_UNLIKELY(!isUsed))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaEnd = uint32_t(Support::bitVectorIndexOf(block->_stopBitVector, areaStart, true)) + 1;
  uint32_t areaPrevSize = areaEnd - areaStart;
  uint32_t spanPrevSize = areaPrevSize * pool->granularity;
  uint32_t areaShrunkSize = pool->areaSizeFromByteSize(newSize);

  if (ASMJIT_UNLIKELY(areaShrunkSize > areaPrevSize))
    return DebugUtils::errored(kErrorInvalidArgument);

  uint32_t areaDiff = areaPrevSize - areaShrunkSize;
  if (areaDiff) {
    block->markShrunkArea(areaStart + areaShrunkSize, areaEnd);
    span._size = pool->byteSizeFromAreaSize(areaShrunkSize);
  }

  // Fill released memory if the secure mode is enabled.
  if (newSize < spanPrevSize && Support::test(impl->options, JitAllocatorOptions::kFillUnusedMemory)) {
    uint8_t* spanPtr = block->rwPtr() + (areaStart + areaShrunkSize) * pool->granularity;
    size_t spanSize = areaDiff * pool->granularity;

    if (!alreadyUnderWriteScope) {
      VirtMem::ProtectJitReadWriteScope scope(spanPtr, spanSize, VirtMem::CachePolicy::kNeverFlush);
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
    else {
      JitAllocatorImpl_fillPattern(spanPtr, impl->fillPattern, spanSize);
    }
  }

  return kErrorOk;
}